

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yl_opt.c
# Opt level: O0

int yl_opt_update_out_format(char *arg,yl_opt *yo)

{
  int iVar1;
  yl_opt *yo_local;
  char *arg_local;
  
  iVar1 = yl_opt_update_schema_out_format(arg,yo);
  if (iVar1 == 0) {
    arg_local._4_4_ = 0;
  }
  else {
    iVar1 = yl_opt_update_data_out_format(arg,yo);
    if (iVar1 == 0) {
      arg_local._4_4_ = 0;
    }
    else {
      iVar1 = yl_opt_update_other_out_format(arg,yo);
      if (iVar1 == 0) {
        arg_local._4_4_ = 0;
      }
      else {
        yl_log('\x01',"Unknown output format %s.",arg);
        arg_local._4_4_ = 1;
      }
    }
  }
  return arg_local._4_4_;
}

Assistant:

int
yl_opt_update_out_format(const char *arg, struct yl_opt *yo)
{
    if (!yl_opt_update_schema_out_format(arg, yo)) {
        return 0;
    }
    if (!yl_opt_update_data_out_format(arg, yo)) {
        return 0;
    }
    if (!yl_opt_update_other_out_format(arg, yo)) {
        return 0;
    }

    YLMSG_E("Unknown output format %s.", arg);
    return 1;
}